

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

int Gia_ManPerformGla(Gia_Man_t *pAig,Abs_Par_t *pPars)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  byte *pbVar3;
  void *pvVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  Gia_Man_t *pGVar12;
  Abc_Cex_t *pAVar13;
  char *pcVar14;
  void *pvVar15;
  void *pvVar16;
  Vec_Wrd_t *p;
  word *pwVar17;
  undefined8 *puVar18;
  undefined8 *puVar19;
  Abc_Frame_t *pAbc;
  Vec_Int_t *pVVar20;
  Gia_Obj_t *pGVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  char *pcVar26;
  Gia_Man_t *p_00;
  uint uVar27;
  size_t __size;
  timespec *ptVar28;
  ulong uVar29;
  Gia_Man_t *pGVar30;
  Ga2_Man_t *p_01;
  Gia_Man_t *pGVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  uint *puVar35;
  bool bVar36;
  double dVar37;
  uint local_470;
  int Lit;
  ulong local_468;
  int local_45c;
  int local_458;
  int local_454;
  Gia_Man_t *local_450;
  uint local_444;
  int local_440;
  uint local_43c;
  Gia_Man_t *local_438;
  Vec_Int_t *local_430;
  long local_428;
  size_t local_420;
  timespec ts;
  
  iVar7 = clock_gettime(3,(timespec *)&ts);
  if (iVar7 < 0) {
    lVar34 = -1;
  }
  else {
    lVar34 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  pPars->iFrame = -1;
  iVar9 = pAig->nRegs;
  pVVar20 = pAig->vCos;
  iVar7 = pVVar20->nSize;
  if (iVar7 - iVar9 != 1) {
    __assert_fail("Gia_ManPoNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                  ,0x5e6,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
  }
  pAVar13 = pAig->pCexSeq;
  if (pAVar13 != (Abc_Cex_t *)0x0) {
    free(pAVar13);
    pAig->pCexSeq = (Abc_Cex_t *)0x0;
    iVar9 = pAig->nRegs;
    pVVar20 = pAig->vCos;
    iVar7 = pVVar20->nSize;
  }
  if (iVar7 <= iVar9) {
LAB_00564267:
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  local_428 = lVar34;
  if (iVar7 < 1) {
LAB_00564248:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar7 = *pVVar20->pArray;
  if ((long)iVar7 < 0) {
LAB_0056420a:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar27 = pAig->nObjs;
  if ((int)uVar27 <= iVar7) goto LAB_0056420a;
  pGVar2 = pAig->pObjs;
  pGVar21 = pGVar2 + iVar7;
  uVar8 = (uint)*(undefined8 *)pGVar21;
  local_438 = pAig;
  if ((~*(ulong *)(pGVar21 + -(ulong)(uVar8 & 0x1fffffff)) & 0x1fffffff1fffffff) == 0) {
    bVar36 = (uVar8 >> 0x1d & 1) != 0;
    if (bVar36) {
      pAVar13 = Abc_CexMakeTriv(iVar9,pAig->vCis->nSize - iVar9,1,0);
      pAig->pCexSeq = pAVar13;
      Abc_Print(iVar9,"Sequential miter is trivially SAT.\n");
    }
    else {
      Abc_Print((int)pAVar13,"Sequential miter is trivially UNSAT.\n");
    }
    return (uint)!bVar36;
  }
  if (pAig->vGateClasses == (Vec_Int_t *)0x0) {
    pVVar10 = (Vec_Int_t *)malloc(0x10);
    uVar29 = 0x10;
    if (0xe < uVar27 - 1) {
      uVar29 = (ulong)uVar27;
    }
    pVVar10->nCap = (int)uVar29;
    piVar11 = (int *)malloc(uVar29 << 2);
    pVVar10->pArray = piVar11;
    pVVar10->nSize = uVar27;
    memset(piVar11,0,(ulong)uVar27 * 4);
    pAig->vGateClasses = pVVar10;
    *piVar11 = 1;
    if (pVVar20->nSize <= iVar9) goto LAB_00564267;
    if (pVVar20->nSize < 1) goto LAB_00564248;
    uVar8 = *pVVar20->pArray;
    if (((long)(int)uVar8 < 0) || (uVar27 <= uVar8)) goto LAB_0056420a;
    uVar8 = uVar8 - (*(uint *)(pGVar2 + (int)uVar8) & 0x1fffffff);
    if (((int)uVar8 < 0) || (uVar27 <= uVar8)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    piVar11[uVar8] = 1;
  }
  p_00 = local_438;
  pGVar12 = (Gia_Man_t *)Ga2_ManStart(local_438,pPars);
  pGVar30 = (Gia_Man_t *)0x3;
  iVar7 = clock_gettime(3,(timespec *)&ts);
  lVar34 = local_428;
  if (iVar7 < 0) {
    lVar23 = -1;
  }
  else {
    lVar23 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  *(long *)&pGVar12->pFanData = lVar23 - local_428;
  if (*(int *)(pGVar12->pSpec + 0x70) != 0) {
    Abc_Print((int)pGVar30,"Running gate-level abstraction (GLA) with the following parameters:\n");
    Abc_Print(pPars->nRatioMin2,
              "FrameMax = %d  ConfMax = %d  Timeout = %d  Limit = %d %%  Limit2 = %d %%  RatioMax = %d %%\n"
              ,(ulong)(uint)pPars->nFramesMax,(ulong)(uint)pPars->nConfLimit,
              (ulong)(uint)pPars->nTimeOut,(ulong)(uint)pPars->nRatioMin,
              (ulong)(uint)pPars->nRatioMin2,(ulong)(uint)pPars->nRatioMax);
    pGVar30 = (Gia_Man_t *)(ulong)(uint)pPars->fUseSimple;
    Abc_Print(pPars->fUseSimple,
              "LrnStart = %d  LrnDelta = %d  LrnRatio = %d %%  Skip = %d  SimpleCNF = %d  Dump = %d\n"
              ,(ulong)(uint)pPars->nLearnedStart,(ulong)(uint)pPars->nLearnedDelta,
              (ulong)(uint)pPars->nLearnedPerce,(ulong)(uint)pPars->fUseSkip,pGVar30,
              (ulong)(uint)(pPars->fDumpMabs | pPars->fDumpVabs));
    if (pPars->fDumpVabs == 0) {
      if (pPars->fDumpMabs != 0) {
        pcVar26 = "Miter with abstraction map";
        goto LAB_005623f2;
      }
    }
    else {
      pcVar26 = "Abstracted model";
LAB_005623f2:
      pGVar30 = pGVar12;
      pcVar14 = Ga2_GlaGetFileName((Ga2_Man_t *)pGVar12,pPars->fDumpVabs);
      Abc_Print((int)pGVar30,"%s will be dumped into file \"%s\".\n",pcVar26,pcVar14);
    }
    Abc_Print((int)pGVar30,
              " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n"
             );
  }
  local_450 = pGVar12;
  if (pPars->nFramesMax < 0) {
    local_468 = 0;
    local_470 = 0xffffffff;
    bVar36 = false;
  }
  else {
    local_470 = 0xffffffff;
    local_45c = 0;
    do {
      pcVar26 = pGVar12->pSpec;
      pcVar26[0x78] = -1;
      pcVar26[0x79] = -1;
      pcVar26[0x7a] = -1;
      pcVar26[0x7b] = -1;
      pGVar30 = pGVar12;
      Ga2_ManRestart((Ga2_Man_t *)pGVar12);
      if (pPars->nFramesMax < 0) {
        uVar29 = 0;
      }
      else {
        local_444 = pGVar12->pMuxes[1];
        uVar29 = 0;
        do {
          local_454 = *(int *)(*(long *)&pGVar12->fSweeper + 0x230);
          local_43c = pGVar12->pMuxes[1];
          local_440 = *(int *)(*(long *)&pGVar12->nXors + 4);
          iVar7 = (int)uVar29;
          *(int *)(pGVar12->pSpec + 0x78) = iVar7;
          puVar35 = *(uint **)&pGVar12->nHTable;
          uVar27 = puVar35[1];
          if (uVar29 == uVar27) {
            pvVar15 = calloc(1,0x10);
            if (uVar27 == *puVar35) {
              if ((int)uVar27 < 0x10) {
                if (*(void **)(puVar35 + 2) == (void *)0x0) {
                  pvVar16 = malloc(0x80);
                }
                else {
                  pvVar16 = realloc(*(void **)(puVar35 + 2),0x80);
                }
                *(void **)(puVar35 + 2) = pvVar16;
                *puVar35 = 0x10;
              }
              else {
                __size = (ulong)uVar27 << 4;
                if (*(void **)(puVar35 + 2) == (void *)0x0) {
                  pvVar16 = malloc(__size);
                }
                else {
                  pvVar16 = realloc(*(void **)(puVar35 + 2),__size);
                }
                *(void **)(puVar35 + 2) = pvVar16;
                *puVar35 = uVar27 * 2;
              }
            }
            else {
              pvVar16 = *(void **)(puVar35 + 2);
            }
            uVar27 = puVar35[1];
            puVar35[1] = uVar27 + 1;
            *(void **)((long)pvVar16 + (long)(int)uVar27 * 8) = pvVar15;
            puVar35 = *(uint **)&pGVar12->nHTable;
            uVar27 = puVar35[1];
            p_00 = local_438;
          }
          if ((long)(int)uVar27 <= (long)uVar29) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          Vec_IntFillExtra(*(Vec_Int_t **)(*(long *)(puVar35 + 2) + uVar29 * 8),
                           *(int *)(*(long *)&pGVar12->nXors + 4),-1);
          pGVar30 = pGVar12;
          Ga2_ManAddAbsClauses((Ga2_Man_t *)pGVar12,iVar7);
          pcVar26 = pGVar12->pSpec;
          if (((*(int *)(pcVar26 + 0x44) == 0) || ((long)*(int *)(pcVar26 + 0x7c) < (long)uVar29))
             && ((long)*(int *)(pcVar26 + 4) == 0 || (long)*(int *)(pcVar26 + 4) < (long)uVar29)) {
            iVar9 = p_00->vCos->nSize;
            if (iVar9 <= p_00->nRegs) goto LAB_00564267;
            if (iVar9 < 1) goto LAB_00564248;
            iVar9 = *p_00->vCos->pArray;
            if (((long)iVar9 < 0) || (p_00->nObjs <= iVar9)) goto LAB_0056420a;
            pGVar30 = pGVar12;
            Lit = Ga2_ObjFindLit((Ga2_Man_t *)pGVar12,
                                 p_00->pObjs + iVar9 +
                                 -(ulong)((uint)*(undefined8 *)(p_00->pObjs + iVar9) & 0x1fffffff),
                                 iVar7);
            if (Lit < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                            ,0x62e,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
            }
            iVar7 = p_00->vCos->nSize;
            if (iVar7 <= p_00->nRegs) goto LAB_00564267;
            if (iVar7 < 1) goto LAB_00564248;
            iVar7 = *p_00->vCos->pArray;
            if (((long)iVar7 < 0) || (p_00->nObjs <= iVar7)) goto LAB_0056420a;
            Lit = *(uint *)(p_00->pObjs + iVar7) >> 0x1d & 1 ^ Lit;
            if (Lit != 0) {
              if (Lit == 1) {
                __assert_fail("Lit > 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                              ,0x632,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
              }
              iVar7 = *(int *)&pGVar12->pRefs;
              local_468 = uVar29;
              if ((*(sat_solver2 **)&pGVar12->fSweeper)->size < iVar7) {
                sat_solver2_setnvars(*(sat_solver2 **)&pGVar12->fSweeper,iVar7);
                if (Lit < 0) {
LAB_00564229:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                                ,0x10c,"int Abc_Lit2Var(int)");
                }
                iVar7 = *(int *)&pGVar12->pRefs;
              }
              local_420 = (long)iVar7 << 2;
              iVar9 = 0;
              local_458 = iVar7;
              while( true ) {
                uVar27 = (uint)Lit >> 1;
                iVar7 = var_is_assigned(*(sat_solver2 **)&pGVar12->fSweeper,uVar27);
                if (iVar7 != 0) break;
                iVar7 = clock_gettime(3,(timespec *)&ts);
                if (iVar7 < 0) {
                  lVar23 = 1;
                }
                else {
                  lVar23 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
                  lVar23 = ((lVar23 >> 7) - (lVar23 >> 0x3f)) + ts.tv_sec * -1000000;
                }
                iVar7 = sat_solver2_solve(*(sat_solver2 **)&pGVar12->fSweeper,&Lit,(lit *)&local_468
                                          ,(long)pPars->nConfLimit,0,0,0);
                if (iVar7 != 1) {
                  pGVar30 = (Gia_Man_t *)0x3;
                  ptVar28 = (timespec *)&ts;
                  iVar32 = clock_gettime(3,ptVar28);
                  uVar22 = local_468;
                  uVar27 = (uint)ptVar28;
                  if (iVar32 < 0) {
                    lVar24 = -1;
                  }
                  else {
                    lVar24 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                  }
                  *(long *)&pGVar12->vFanoutNums = *(long *)&pGVar12->vFanoutNums + lVar24 + lVar23;
                  if (iVar7 == 0) {
                    bVar36 = false;
                    goto LAB_00563667;
                  }
                  pGVar30 = *(Gia_Man_t **)&pGVar12->fSweeper;
                  if (pGVar30->vSims != (Vec_Wrd_t *)0x0) {
                    ptVar28 = (timespec *)&ts;
                    iVar7 = clock_gettime(3,ptVar28);
                    uVar27 = (uint)ptVar28;
                    if (iVar7 < 0) {
                      lVar23 = -1;
                    }
                    else {
                      lVar23 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                    }
                    pGVar30 = *(Gia_Man_t **)&pGVar12->fSweeper;
                    uVar29 = local_468;
                    if ((long)pGVar30->vSims < lVar23) goto LAB_00563664;
                  }
                  pcVar26 = pGVar12->pSpec;
                  if (iVar9 == 0) {
                    iVar9 = 0;
                    if ((long)*(int *)(pcVar26 + 0x7c) < (long)uVar22) {
                      *(int *)(pcVar26 + 0x80) = *(int *)(pcVar26 + 0x80) + 1;
                    }
                    goto LAB_005632bb;
                  }
                  if ((long)*(int *)(pcVar26 + 0x7c) < (long)uVar22) {
                    pcVar26[0x80] = '\0';
                    pcVar26[0x81] = '\0';
                    pcVar26[0x82] = '\0';
                    pcVar26[0x83] = '\0';
                  }
                  if (pGVar30->vCiNumsOrig == (Vec_Int_t *)0x0) {
                    __assert_fail("p->pSat->pPrf2 != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                                  ,0x694,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
                  }
                  local_430 = (Vec_Int_t *)Sat_ProofCore((sat_solver2 *)pGVar30);
                  lVar23 = *(long *)&pGVar12->fSweeper;
                  pvVar15 = *(void **)(lVar23 + 0x1e8);
                  if (pvVar15 != (void *)0x0) {
                    pvVar16 = *(void **)((long)pvVar15 + 0x20);
                    pvVar4 = *(void **)((long)pvVar16 + 8);
                    if (pvVar4 != (void *)0x0) {
                      free(pvVar4);
                    }
                    free(pvVar16);
                    pvVar16 = *(void **)((long)pvVar15 + 0x18);
                    pvVar4 = *(void **)((long)pvVar16 + 8);
                    if (pvVar4 != (void *)0x0) {
                      free(pvVar4);
                    }
                    free(pvVar16);
                    free(pvVar15);
                    pGVar12 = local_450;
                  }
                  *(undefined8 *)(lVar23 + 0x1e8) = 0;
                  sat_solver2_rollback(*(sat_solver2 **)&pGVar12->fSweeper);
                  iVar7 = local_458;
                  Ga2_ManShrinkAbs((Ga2_Man_t *)pGVar12,local_43c,local_440,local_458);
                  piVar11 = *(int **)&pGVar12->fSweeper;
                  if (iVar7 != *piVar11) {
                    __assert_fail("nVarsOld == p->pSat->size",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                                  ,0x6a4,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
                  }
                  if (piVar11[2] != piVar11[3]) {
LAB_005642a5:
                    __assert_fail("s->qhead == s->qtail",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.h"
                                  ,0xfa,"void sat_solver2_bookmark(sat_solver2 *)");
                  }
                  piVar11[0x36] = iVar7;
                  piVar11[0x37] = piVar11[2];
                  pbVar3 = *(byte **)(piVar11 + 0x72);
                  if (pbVar3 != (byte *)0x0) {
                    piVar11[0x38] =
                         (*(int *)(pbVar3 + 0xc) << (*pbVar3 & 0x1f)) +
                         **(int **)(*(long *)(pbVar3 + 0x18) + (long)*(int *)(pbVar3 + 0xc) * 8);
                  }
                  *(undefined8 *)(piVar11 + 0x22) = *(undefined8 *)(piVar11 + 0x1e);
                  piVar11[0x20] =
                       piVar11[0x24] << (*(byte *)(piVar11 + 0x26) & 0x1f) |
                       **(uint **)(*(long *)(piVar11 + 0x2a) + (long)piVar11[0x24] * 8);
                  piVar11[0x21] =
                       piVar11[0x25] << (*(byte *)(piVar11 + 0x26) & 0x1f) |
                       **(uint **)(*(long *)(piVar11 + 0x2a) + (long)piVar11[0x25] * 8);
                  if (*(void **)(piVar11 + 0x10) != (void *)0x0) {
                    piVar11[0xc] = piVar11[0xb];
                    memcpy(*(void **)(piVar11 + 0x10),*(void **)(piVar11 + 0xe),local_420);
                    piVar11 = *(int **)&pGVar12->fSweeper;
                  }
                  if (*(long *)(piVar11 + 0x7a) != 0) {
                    __assert_fail("p->pSat->pPrf2 == NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                                  ,0x6a7,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
                  }
                  puVar18 = (undefined8 *)calloc(1,0x30);
                  *puVar18 = 0xffffffffffffffff;
                  puVar19 = (undefined8 *)malloc(0x10);
                  *puVar19 = 1000;
                  pvVar15 = malloc(8000);
                  puVar19[1] = pvVar15;
                  puVar18[3] = puVar19;
                  puVar19 = (undefined8 *)malloc(0x10);
                  *puVar19 = 1000;
                  pvVar15 = malloc(4000);
                  pGVar12 = local_450;
                  puVar19[1] = pvVar15;
                  puVar18[4] = puVar19;
                  *(undefined8 **)(piVar11 + 0x7a) = puVar18;
                  local_450->nBufs = 0;
                  pGVar2 = local_450->pObjs;
                  uVar27 = *(uint *)(local_450->pName + 0x18);
                  if ((int)*(uint *)pGVar2 < (int)uVar27) {
                    if (*(void **)&pGVar2->Value == (void *)0x0) {
                      pvVar15 = malloc((long)(int)uVar27 << 2);
                    }
                    else {
                      pvVar15 = realloc(*(void **)&pGVar2->Value,(long)(int)uVar27 << 2);
                    }
                    *(void **)&pGVar2->Value = pvVar15;
                    if (pvVar15 == (void *)0x0) {
LAB_0056437e:
                      __assert_fail("p->pArray",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
                    }
                    *(uint *)pGVar2 = uVar27;
                  }
                  if (0 < (int)uVar27) {
                    memset(*(void **)&pGVar2->Value,0xff,(ulong)uVar27 * 4);
                  }
                  pVVar20 = local_430;
                  *(uint *)&pGVar2->field_0x4 = uVar27;
                  piVar11 = *(int **)(*(long *)&pGVar12->fSweeper + 0x1e8);
                  if (*piVar11 != -1) {
LAB_005642c4:
                    __assert_fail("p->iFirst == -1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satProof2.h"
                                  ,0x7a,"void Prf_ManRestart(Prf_Man_t *, Vec_Int_t *, int, int)");
                  }
                  uVar27 = local_430->nSize;
                  pGVar2 = pGVar12->pObjs;
                  *piVar11 = *(int *)(*(long *)&pGVar12->fSweeper + 0x210);
                  piVar11[2] = (((int)uVar27 >> 6) + 1) - (uint)((uVar27 & 0x3f) == 0);
                  *(Gia_Obj_t **)(piVar11 + 10) = pGVar2;
                  piVar11[4] = 0;
                  piVar11[5] = 0;
                  *(undefined4 *)(*(long *)(piVar11 + 6) + 4) = 0;
                  Ga2_ManAddToAbs((Ga2_Man_t *)pGVar12,local_430);
                  piVar11 = pVVar20->pArray;
                  if (piVar11 != (int *)0x0) {
                    free(piVar11);
                  }
                  free(pVVar20);
                  iVar7 = clock_gettime(3,(timespec *)&ts);
                  if (iVar7 < 0) {
                    lVar23 = 1;
                  }
                  else {
                    lVar23 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
                    lVar23 = ((lVar23 >> 7) - (lVar23 >> 0x3f)) + ts.tv_sec * -1000000;
                  }
                  pGVar30 = *(Gia_Man_t **)&pGVar12->fSweeper;
                  bVar36 = false;
                  iVar7 = sat_solver2_solve((sat_solver2 *)pGVar30,&Lit,(lit *)&local_468,
                                            (long)pPars->nConfLimit,0,0,0);
                  if (iVar7 != -1) {
                    if (iVar7 != 0) {
                      __assert_fail("Status == l_False",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                                    ,0x6b7,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
                    }
                    goto LAB_00563667;
                  }
                  iVar7 = clock_gettime(3,(timespec *)&ts);
                  if (iVar7 < 0) {
                    lVar24 = -1;
                  }
                  else {
                    lVar24 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                  }
                  *(long *)&pGVar12->vFanoutNums = *(long *)&pGVar12->vFanoutNums + lVar24 + lVar23;
                  if ((*(sat_solver2 **)&pGVar12->fSweeper)->pPrf2 == (Prf_Man_t *)0x0) {
                    __assert_fail("p->pSat->pPrf2 != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                                  ,0x6bb,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
                  }
                  pVVar20 = (Vec_Int_t *)Sat_ProofCore(*(sat_solver2 **)&pGVar12->fSweeper);
                  lVar23 = *(long *)&pGVar12->fSweeper;
                  pvVar15 = *(void **)(lVar23 + 0x1e8);
                  if (pvVar15 != (void *)0x0) {
                    pvVar16 = *(void **)((long)pvVar15 + 0x20);
                    pvVar4 = *(void **)((long)pvVar16 + 8);
                    if (pvVar4 != (void *)0x0) {
                      free(pvVar4);
                    }
                    free(pvVar16);
                    pvVar16 = *(void **)((long)pvVar15 + 0x18);
                    pvVar4 = *(void **)((long)pvVar16 + 8);
                    if (pvVar4 != (void *)0x0) {
                      free(pvVar4);
                    }
                    free(pvVar16);
                    free(pvVar15);
                    pGVar12 = local_450;
                  }
                  *(undefined8 *)(lVar23 + 0x1e8) = 0;
                  sat_solver2_rollback(*(sat_solver2 **)&pGVar12->fSweeper);
                  Ga2_ManShrinkAbs((Ga2_Man_t *)pGVar12,local_43c,local_440,local_458);
                  pVVar10 = pVVar20;
                  Ga2_ManAddToAbs((Ga2_Man_t *)pGVar12,pVVar20);
                  uVar27 = (uint)pVVar10;
                  if (pVVar20->pArray != (int *)0x0) {
                    free(pVVar20->pArray);
                  }
                  free(pVVar20);
                  uVar22 = local_468;
                  goto LAB_005632bb;
                }
                piVar11 = (int *)((long)&pGVar12->pRefs + 4);
                *piVar11 = *piVar11 + 1;
                p_01 = (Ga2_Man_t *)0x3;
                ptVar28 = (timespec *)&ts;
                iVar7 = clock_gettime(3,ptVar28);
                iVar32 = (int)ptVar28;
                if (iVar7 < 0) {
                  lVar24 = -1;
                }
                else {
                  lVar24 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                }
                *(int **)&pGVar12->nFansAlloc =
                     (int *)((long)*(int **)&pGVar12->nFansAlloc + lVar24 + lVar23);
                iVar7 = Abc_FrameIsBridgeMode();
                if (local_45c != 0 && iVar7 != 0) {
                  Gia_Ga2SendCancel(p_01,iVar32);
                  local_45c = 0;
                }
                if (-1 < (int)local_470) {
                  Gia_GlaProveCancel(pPars->fVerbose);
                  local_470 = 0xffffffff;
                }
                iVar7 = clock_gettime(3,(timespec *)&ts);
                if (iVar7 < 0) {
                  lVar23 = 1;
                }
                else {
                  lVar23 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
                  lVar23 = ((lVar23 >> 7) - (lVar23 >> 0x3f)) + ts.tv_sec * -1000000;
                }
                pGVar12->pHTable[8] = iVar9;
                pGVar30 = (Gia_Man_t *)Ga2_ManRefine((Ga2_Man_t *)pGVar12);
                pGVar31 = (Gia_Man_t *)0x3;
                iVar7 = clock_gettime(3,(timespec *)&ts);
                if (iVar7 < 0) {
                  lVar24 = -1;
                }
                else {
                  lVar24 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                }
                pGVar12->vFanout = (Vec_Int_t *)((long)&pGVar12->vFanout->nCap + lVar24 + lVar23);
                if (pGVar30 == (Gia_Man_t *)0x0) {
                  pGVar30 = pGVar31;
                  uVar29 = local_468;
                  if (pPars->fVerbose != 0) {
                    iVar32 = *(int *)(*(long *)&pGVar12->fSweeper + 0x230) - local_454;
                    iVar7 = clock_gettime(3,(timespec *)&ts);
                    if (iVar7 < 0) {
                      lVar23 = -1;
                    }
                    else {
                      lVar23 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                    }
                    pGVar30 = pGVar12;
                    Ga2_ManAbsPrintFrame
                              ((Ga2_Man_t *)pGVar12,(int)local_468,iVar32,iVar9,lVar23 - lVar34,1);
                    uVar29 = local_468;
                  }
                  goto LAB_00563664;
                }
                piVar11 = *(int **)&pGVar12->fSweeper;
                if (iVar9 == 0) {
                  if (local_458 != *piVar11) {
                    __assert_fail("nVarsOld == p->pSat->size",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                                  ,0x666,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
                  }
                  if (piVar11[2] != piVar11[3]) goto LAB_005642a5;
                  piVar11[0x36] = local_458;
                  piVar11[0x37] = piVar11[2];
                  pbVar3 = *(byte **)(piVar11 + 0x72);
                  if (pbVar3 != (byte *)0x0) {
                    piVar11[0x38] =
                         (*(int *)(pbVar3 + 0xc) << (*pbVar3 & 0x1f)) +
                         **(int **)(*(long *)(pbVar3 + 0x18) + (long)*(int *)(pbVar3 + 0xc) * 8);
                  }
                  *(undefined8 *)(piVar11 + 0x22) = *(undefined8 *)(piVar11 + 0x1e);
                  piVar11[0x20] =
                       piVar11[0x24] << (*(byte *)(piVar11 + 0x26) & 0x1f) |
                       **(uint **)(*(long *)(piVar11 + 0x2a) + (long)piVar11[0x24] * 8);
                  piVar11[0x21] =
                       piVar11[0x25] << (*(byte *)(piVar11 + 0x26) & 0x1f) |
                       **(uint **)(*(long *)(piVar11 + 0x2a) + (long)piVar11[0x25] * 8);
                  if (*(void **)(piVar11 + 0x10) != (void *)0x0) {
                    piVar11[0xc] = piVar11[0xb];
                    memcpy(*(void **)(piVar11 + 0x10),*(void **)(piVar11 + 0xe),local_420);
                    piVar11 = *(int **)&pGVar12->fSweeper;
                  }
                  if (*(long *)(piVar11 + 0x7a) != 0) {
                    __assert_fail("p->pSat->pPrf2 == NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                                  ,0x669,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
                  }
                  puVar18 = (undefined8 *)calloc(1,0x30);
                  *puVar18 = 0xffffffffffffffff;
                  puVar19 = (undefined8 *)malloc(0x10);
                  *puVar19 = 1000;
                  pvVar15 = malloc(8000);
                  puVar19[1] = pvVar15;
                  puVar18[3] = puVar19;
                  puVar19 = (undefined8 *)malloc(0x10);
                  *puVar19 = 1000;
                  pvVar15 = malloc(4000);
                  pGVar12 = local_450;
                  puVar19[1] = pvVar15;
                  puVar18[4] = puVar19;
                  *(undefined8 **)(piVar11 + 0x7a) = puVar18;
                  local_450->nBufs = 0;
                  pGVar2 = local_450->pObjs;
                  uVar27 = *(uint *)(local_450->pName + 0x18);
                  if ((int)*(uint *)pGVar2 < (int)uVar27) {
                    if (*(void **)&pGVar2->Value == (void *)0x0) {
                      pvVar15 = malloc((long)(int)uVar27 << 2);
                    }
                    else {
                      pvVar15 = realloc(*(void **)&pGVar2->Value,(long)(int)uVar27 << 2);
                    }
                    *(void **)&pGVar2->Value = pvVar15;
                    if (pvVar15 == (void *)0x0) goto LAB_0056437e;
                    *(uint *)pGVar2 = uVar27;
                  }
                  if (0 < (int)uVar27) {
                    memset(*(void **)&pGVar2->Value,0xff,(ulong)uVar27 * 4);
                  }
                  *(uint *)&pGVar2->field_0x4 = uVar27;
                  piVar11 = *(int **)(*(long *)&pGVar12->fSweeper + 0x1e8);
                  if (*piVar11 != -1) goto LAB_005642c4;
                  uVar27 = *(int *)((long)&pGVar30->pName + 4);
                  pGVar2 = pGVar12->pObjs;
                  *piVar11 = *(int *)(*(long *)&pGVar12->fSweeper + 0x210);
                  piVar11[2] = (((int)uVar27 >> 6) + 1) - (uint)((uVar27 & 0x3f) == 0);
                  *(Gia_Obj_t **)(piVar11 + 10) = pGVar2;
                  piVar11[4] = 0;
                  piVar11[5] = 0;
                  *(undefined4 *)(*(long *)(piVar11 + 6) + 4) = 0;
                }
                else {
                  piVar11 = *(int **)(piVar11 + 0x7a);
                  if (piVar11 != (int *)0x0) {
                    if (*piVar11 < 0) {
                      __assert_fail("p->iFirst >= 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satProof2.h"
                                    ,0x85,"void Prf_ManGrow(Prf_Man_t *, int)");
                    }
                    if (*(long *)(piVar11 + 4) != 0) {
                      __assert_fail("p->pInfo == NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satProof2.h"
                                    ,0x86,"void Prf_ManGrow(Prf_Man_t *, int)");
                    }
                    uVar27 = *(int *)((long)&pGVar30->pName + 4) + pGVar12->nBufs;
                    iVar7 = piVar11[2];
                    if (iVar7 * 0x40 <= (int)uVar27) {
                      iVar32 = (((int)uVar27 >> 6) + 1) - (uint)((uVar27 & 0x3f) == 0);
                      iVar33 = iVar7 * 2;
                      if (iVar32 == iVar33 || SBORROW4(iVar32,iVar33) != iVar32 + iVar7 * -2 < 0) {
                        iVar32 = iVar33;
                      }
                      pvVar15 = *(void **)(piVar11 + 6);
                      uVar29 = (long)*(int *)((long)pvVar15 + 4) / (long)iVar7;
                      local_430 = (Vec_Int_t *)(uVar29 & 0xffffffff);
                      iVar7 = ((int)uVar29 + 1000) * iVar32;
                      p = (Vec_Wrd_t *)malloc(0x10);
                      if (iVar7 - 1U < 0xf) {
                        iVar7 = 0x10;
                      }
                      p->nSize = 0;
                      p->nCap = iVar7;
                      if (iVar7 == 0) {
                        pwVar17 = (word *)0x0;
                      }
                      else {
                        pwVar17 = (word *)malloc((long)iVar7 << 3);
                      }
                      p->pArray = pwVar17;
                      if (0 < (int)local_430) {
                        iVar7 = 0;
                        do {
                          uVar27 = piVar11[2] * iVar7;
                          if (((int)uVar27 < 0) ||
                             (*(int *)(*(long *)(piVar11 + 6) + 4) <= (int)uVar27)) {
                            __assert_fail("i >= 0 && i < p->nSize",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                                          ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
                          }
                          *(ulong *)(piVar11 + 4) =
                               (ulong)uVar27 * 8 + *(long *)(*(long *)(piVar11 + 6) + 8);
                          lVar34 = 0;
                          if (0 < piVar11[2]) {
                            do {
                              Vec_WrdPush(p,*(word *)(*(long *)(piVar11 + 4) + lVar34 * 8));
                              lVar34 = lVar34 + 1;
                            } while (lVar34 < piVar11[2]);
                          }
                          iVar33 = iVar32 - (int)lVar34;
                          if (iVar33 != 0 && (int)lVar34 <= iVar32) {
                            do {
                              Vec_WrdPush(p,0);
                              iVar33 = iVar33 + -1;
                            } while (iVar33 != 0);
                          }
                          iVar7 = iVar7 + 1;
                        } while (iVar7 != (int)local_430);
                        pvVar15 = *(void **)(piVar11 + 6);
                      }
                      if (*(void **)((long)pvVar15 + 8) != (void *)0x0) {
                        free(*(void **)((long)pvVar15 + 8));
                      }
                      free(pvVar15);
                      *(Vec_Wrd_t **)(piVar11 + 6) = p;
                      piVar11[2] = iVar32;
                      piVar11[4] = 0;
                      piVar11[5] = 0;
                      pGVar12 = local_450;
                      lVar34 = local_428;
                    }
                  }
                }
                Ga2_ManAddToAbs((Ga2_Man_t *)pGVar12,(Vec_Int_t *)pGVar30);
                p_00 = local_438;
                if (pGVar30->pSpec != (char *)0x0) {
                  free(pGVar30->pSpec);
                }
                free(pGVar30);
                if (pPars->fVerbose != 0) {
                  iVar7 = *(int *)(*(long *)&pGVar12->fSweeper + 0x230);
                  iVar32 = clock_gettime(3,(timespec *)&ts);
                  if (iVar32 < 0) {
                    lVar23 = -1;
                  }
                  else {
                    lVar23 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                  }
                  pGVar30 = pGVar12;
                  Ga2_ManAbsPrintFrame
                            ((Ga2_Man_t *)pGVar12,(int)local_468,iVar7 - local_454,iVar9 + 1,
                             lVar23 - lVar34,0);
                }
                if ((pPars->nRatioMin2 != 0) &&
                   (uVar29 = local_468,
                   (pPars->nRatioMin2 * *(int *)((long)&pGVar12->vCis + 4)) / 100 <=
                   (int)pGVar12->pMuxes[1])) goto LAB_00563664;
                iVar9 = iVar9 + 1;
                if (Lit < 0) goto LAB_00564229;
              }
              lVar23 = *(long *)&pGVar12->fSweeper;
              pvVar15 = *(void **)(lVar23 + 0x1e8);
              if (pvVar15 != (void *)0x0) {
                pvVar16 = *(void **)((long)pvVar15 + 0x20);
                pvVar4 = *(void **)((long)pvVar16 + 8);
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
                free(pvVar16);
                pvVar16 = *(void **)((long)pvVar15 + 0x18);
                pvVar4 = *(void **)((long)pvVar16 + 8);
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
                free(pvVar16);
                free(pvVar15);
              }
              *(undefined8 *)(lVar23 + 0x1e8) = 0;
              uVar22 = local_468;
LAB_005632bb:
              if ((long)*(int *)(pGVar12->pSpec + 0x7c) < (long)uVar22) {
                *(int *)(pGVar12->pSpec + 0x7c) = (int)uVar22;
              }
              if (pPars->fVerbose == 0) {
                pGVar30 = (Gia_Man_t *)0x0;
              }
              else {
                iVar7 = *(int *)(*(long *)&pGVar12->fSweeper + 0x230);
                iVar32 = clock_gettime(3,(timespec *)&ts);
                if (iVar32 < 0) {
                  lVar23 = -1;
                }
                else {
                  lVar23 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                }
                uVar27 = (uint)local_468;
                Ga2_ManAbsPrintFrame
                          ((Ga2_Man_t *)pGVar12,uVar27,iVar7 - local_454,iVar9,lVar23 - lVar34,1);
                pGVar30 = (Gia_Man_t *)(ulong)(uint)pPars->fVerbose;
              }
              iVar7 = Gia_GlaProveCheck((int)pGVar30);
              if (iVar7 != 0) {
                bVar36 = true;
                goto LAB_00563667;
              }
              if (iVar9 != 0) {
                if (*(int *)(pGVar12->pSpec + 0x74) != 0) {
                  uVar27 = 0x82700a;
                  Abc_Print((int)pGVar30,"\n");
                }
                pVVar20 = p_00->vGateClasses;
                if (pVVar20 != (Vec_Int_t *)0x0) {
                  if (pVVar20->pArray != (int *)0x0) {
                    free(pVVar20->pArray);
                    p_00->vGateClasses->pArray = (int *)0x0;
                    pVVar20 = p_00->vGateClasses;
                    if (pVVar20 == (Vec_Int_t *)0x0) goto LAB_005633c6;
                  }
                  free(pVVar20);
                  p_00->vGateClasses = (Vec_Int_t *)0x0;
                }
LAB_005633c6:
                pGVar30 = pGVar12;
                pVVar20 = Ga2_ManAbsTranslate((Ga2_Man_t *)pGVar12);
                p_00->vGateClasses = pVVar20;
                if ((pPars->nRatioMin != 0) &&
                   (uVar29 = local_468,
                   (pPars->nRatioMin * *(int *)((long)&pGVar12->vCis + 4)) / 100 <=
                   (int)pGVar12->pMuxes[1])) goto LAB_00563664;
              }
              uVar29 = local_468;
              pcVar26 = pGVar12->pSpec;
              if (*(int *)(pcVar26 + 0x80) == *(int *)(pcVar26 + 0x84)) {
                uVar8 = (uint)local_468;
                if ((*(int *)(pcVar26 + 0x54) != 0) || (*(int *)(pcVar26 + 0x58) != 0)) {
                  Abc_FrameSetStatus(-1);
                  Abc_FrameSetCex((Abc_Cex_t *)0x0);
                  Abc_FrameSetNFrames(uVar8);
                  pcVar26 = *(char **)(pGVar12->pSpec + 0x68);
                  if (pcVar26 == (char *)0x0) {
                    pcVar26 = "glabs.aig";
                  }
                  pcVar26 = Extra_FileNameGenericAppend(pcVar26,".status");
                  sprintf((char *)&ts,"write_status %s",pcVar26);
                  pAbc = Abc_FrameGetGlobalFrame();
                  Cmd_CommandExecute(pAbc,(char *)&ts);
                  uVar27 = pPars->fVerbose;
                  pGVar30 = pGVar12;
                  Ga2_GlaDumpAbsracted((Ga2_Man_t *)pGVar12,uVar27);
                  pcVar26 = pGVar12->pSpec;
                }
                if (*(int *)(pcVar26 + 0x5c) != 0) {
                  if (-1 < (int)local_470) {
                    Gia_GlaProveCancel(pPars->fVerbose);
                  }
                  uVar27 = pPars->fSimpProver;
                  pGVar30 = p_00;
                  Gia_GlaProveAbsracted(p_00,uVar27,pPars->fVeryVerbose);
                  piVar11 = (int *)((long)&pGVar12->vLevels + 4);
                  *piVar11 = *piVar11 + 1;
                  local_470 = uVar8;
                }
                iVar7 = Abc_FrameIsBridgeMode();
                if (iVar7 != 0) {
                  if (local_45c != 0) {
                    Gia_Ga2SendCancel((Ga2_Man_t *)pGVar30,uVar27);
                  }
                  pGVar30 = pGVar12;
                  Gia_Ga2SendAbsracted((Ga2_Man_t *)pGVar12,uVar27);
                  local_45c = 1;
                }
              }
              if ((pPars->nRatioMax != 0 && iVar9 != 0) &&
                 (((0x14 < uVar29 || (100 < (int)pGVar12->pMuxes[1])) &&
                  ((int)(pPars->nRatioMax * local_444) / 100 <=
                   (int)(pGVar12->pMuxes[1] - local_444))))) {
                if (*(int *)(pGVar12->pSpec + 0x70) != 0) {
                  Abc_Print((int)pGVar30,
                            "Forcing restart because abstraction grew from %d to %d (more than %d %%).\n"
                            ,(ulong)local_444);
                }
                break;
              }
            }
          }
          uVar29 = uVar29 + 1;
        } while ((int)uVar29 < pPars->nFramesMax || pPars->nFramesMax == 0);
      }
    } while ((int)uVar29 < pPars->nFramesMax || pPars->nFramesMax == 0);
LAB_00563664:
    local_468 = uVar29;
    bVar36 = false;
  }
LAB_00563667:
  iVar7 = (int)pGVar30;
  lVar23 = *(long *)&pGVar12->fSweeper;
  pvVar15 = *(void **)(lVar23 + 0x1e8);
  if (pvVar15 != (void *)0x0) {
    pvVar16 = *(void **)((long)pvVar15 + 0x20);
    pvVar4 = *(void **)((long)pvVar16 + 8);
    if (pvVar4 != (void *)0x0) {
      free(pvVar4);
    }
    free(pvVar16);
    pvVar16 = *(void **)((long)pvVar15 + 0x18);
    pvVar4 = *(void **)((long)pvVar16 + 8);
    if (pvVar4 != (void *)0x0) {
      free(pvVar4);
    }
    free(pvVar16);
    free(pvVar15);
    iVar7 = (int)pvVar15;
  }
  *(undefined8 *)(lVar23 + 0x1e8) = 0;
  if (-1 < (int)local_470) {
    iVar7 = pPars->fVerbose;
    Gia_GlaProveCancel(iVar7);
  }
  pGVar30 = local_450;
  uVar29 = local_468;
  if (*(int *)&local_450->vCos == 0) {
    Abc_Print(iVar7,"\n");
  }
  if (bVar36) {
    Abc_Print(iVar7,"GLA completed %d frames and proved abstraction derived in frame %d  ",
              (ulong)(*(int *)(pGVar30->pSpec + 0x7c) + 1),(ulong)local_470);
    goto LAB_0056399e;
  }
  pAVar13 = p_00->pCexSeq;
  if (pAVar13 != (Abc_Cex_t *)0x0) {
    if (*(int *)(pGVar30->pSpec + 0x70) != 0) {
      Abc_Print(iVar7,"\n");
      pAVar13 = p_00->pCexSeq;
    }
    pGVar12 = p_00;
    iVar7 = Gia_ManVerifyCex(p_00,pAVar13,0);
    iVar9 = (int)pGVar12;
    if (iVar7 == 0) {
      Abc_Print(iVar9,"    Gia_ManPerformGlaOld(): CEX verification has failed!\n");
    }
    Abc_Print(iVar9,"True counter-example detected in frame %d.  ",uVar29 & 0xffffffff);
    *(int *)(pGVar30->pSpec + 0x78) = (int)uVar29 + -1;
    pVVar20 = p_00->vGateClasses;
    if (pVVar20 != (Vec_Int_t *)0x0) {
      if (pVVar20->pArray != (int *)0x0) {
        free(pVVar20->pArray);
        p_00->vGateClasses->pArray = (int *)0x0;
        pVVar20 = p_00->vGateClasses;
        if (pVVar20 == (Vec_Int_t *)0x0) goto LAB_0056399e;
      }
      free(pVVar20);
      p_00->vGateClasses = (Vec_Int_t *)0x0;
    }
    goto LAB_0056399e;
  }
  pVVar20 = p_00->vGateClasses;
  if (pVVar20 != (Vec_Int_t *)0x0) {
    if (pVVar20->pArray != (int *)0x0) {
      free(pVVar20->pArray);
      p_00->vGateClasses->pArray = (int *)0x0;
      pVVar20 = p_00->vGateClasses;
      if (pVVar20 == (Vec_Int_t *)0x0) goto LAB_0056381a;
    }
    free(pVVar20);
    p_00->vGateClasses = (Vec_Int_t *)0x0;
  }
LAB_0056381a:
  pGVar12 = pGVar30;
  pVVar20 = Ga2_ManAbsTranslate((Ga2_Man_t *)pGVar30);
  uVar27 = (uint)pGVar12;
  p_00->vGateClasses = pVVar20;
  if (*(int *)(pGVar30->pSpec + 0x20) == 0) {
LAB_0056388d:
    uVar8 = pPars->nConfLimit;
    if ((uVar8 != 0) && ((int)uVar8 <= *(int *)(*(long *)&pGVar30->fSweeper + 0x230))) {
      iVar7 = *(int *)(pGVar30->pSpec + 0x7c);
      uVar1 = *(uint *)(pGVar30->pSpec + 0x80);
      pcVar26 = "GLA exceeded %d conflicts in frame %d with a %d-stable abstraction.  ";
      goto LAB_0056395c;
    }
    uVar8 = pPars->nRatioMin2;
    uVar29 = (ulong)uVar8;
    if ((uVar8 == 0) ||
       ((int)pGVar30->pMuxes[1] < (int)(*(int *)((long)&pGVar30->vCis + 4) * uVar8) / 100)) {
      uVar8 = pPars->nRatioMin;
      uVar29 = (ulong)uVar8;
      if (uVar8 == 0) {
        pcVar26 = pGVar30->pSpec;
        uVar8 = uVar27;
      }
      else {
        pcVar26 = pGVar30->pSpec;
        iVar7 = *(int *)((long)&pGVar30->vCis + 4) * uVar8;
        uVar8 = iVar7 >> 0x1f;
        uVar27 = -uVar8;
        uVar8 = uVar8 >> 0x1f;
        if (iVar7 / 100 <= (int)pGVar30->pMuxes[1]) {
          uVar22 = (ulong)(*(int *)(pcVar26 + 0x7c) + 1);
          pcVar26 = "GLA found that the size of abstraction exceeds %d %% in frame %d.  ";
          goto LAB_0056398d;
        }
      }
      uVar27 = uVar8;
      uVar22 = (ulong)*(uint *)(pcVar26 + 0x80);
      uVar29 = (ulong)(*(int *)(pcVar26 + 0x7c) + 1);
      pcVar26 = "GLA finished %d frames and produced a %d-stable abstraction.  ";
    }
    else {
      uVar22 = (ulong)(*(int *)(pGVar30->pSpec + 0x7c) + 1);
      pcVar26 = 
      "GLA found that the size of abstraction exceeds %d %% in frame %d during refinement.  ";
    }
LAB_0056398d:
    Abc_Print(uVar27,pcVar26,uVar29,uVar22);
  }
  else {
    uVar27 = 3;
    iVar7 = clock_gettime(3,(timespec *)&ts);
    if (iVar7 < 0) {
      lVar23 = -1;
    }
    else {
      lVar23 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    if (lVar23 < *(long *)(*(long *)&pGVar30->fSweeper + 0x260)) goto LAB_0056388d;
    pcVar26 = pGVar30->pSpec;
    uVar8 = *(uint *)(pcVar26 + 0x20);
    iVar7 = *(int *)(pcVar26 + 0x7c);
    uVar1 = *(uint *)(pcVar26 + 0x80);
    pcVar26 = "GLA reached timeout %d sec in frame %d with a %d-stable abstraction.    ";
LAB_0056395c:
    Abc_Print(uVar27,pcVar26,(ulong)uVar8,(ulong)(iVar7 + 1),(ulong)uVar1);
  }
  *(undefined4 *)(pGVar30->pSpec + 0x78) = *(undefined4 *)(pGVar30->pSpec + 0x7c);
LAB_0056399e:
  iVar9 = 3;
  iVar7 = clock_gettime(3,(timespec *)&ts);
  if (iVar7 < 0) {
    lVar23 = -1;
  }
  else {
    lVar23 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  Abc_Print(iVar9,"%s =","Time");
  Abc_Print(iVar9,"%9.2f sec\n",(double)(lVar23 - lVar34) / 1000000.0);
  if (*(int *)(pGVar30->pSpec + 0x70) != 0) {
    iVar9 = 3;
    iVar7 = clock_gettime(3,(timespec *)&ts);
    lVar24 = -1;
    lVar23 = -1;
    if (-1 < iVar7) {
      lVar23 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    pGVar30->vMapping =
         (Vec_Int_t *)
         (lVar23 - ((long)*(int **)&pGVar30->nFansAlloc +
                   (long)&pGVar30->vFanout->nCap +
                   lVar34 + *(long *)&pGVar30->vFanoutNums + *(long *)&pGVar30->pFanData));
    Abc_Print(iVar9,"%s =","Runtime: Initializing");
    lVar23._0_4_ = *(int *)&pGVar30->pFanData;
    lVar23._4_4_ = *(int *)((long)&pGVar30->pFanData + 4);
    iVar9 = 3;
    iVar7 = clock_gettime(3,(timespec *)&ts);
    if (-1 < iVar7) {
      lVar24 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    dVar37 = 0.0;
    if (lVar24 != lVar34) {
      lVar24._0_4_ = *(int *)&pGVar30->pFanData;
      lVar24._4_4_ = *(int *)((long)&pGVar30->pFanData + 4);
      iVar9 = 3;
      iVar7 = clock_gettime(3,(timespec *)&ts);
      if (iVar7 < 0) {
        lVar25 = -1;
      }
      else {
        lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      dVar37 = ((double)lVar24 * 100.0) / (double)(lVar25 - lVar34);
    }
    Abc_Print(iVar9,"%9.2f sec (%6.2f %%)\n",(double)lVar23 / 1000000.0,dVar37);
    Abc_Print(iVar9,"%s =","Runtime: Solver UNSAT");
    lVar25._0_4_ = *(int *)&pGVar30->vFanoutNums;
    lVar25._4_4_ = *(int *)((long)&pGVar30->vFanoutNums + 4);
    iVar9 = 3;
    iVar7 = clock_gettime(3,(timespec *)&ts);
    if (iVar7 < 0) {
      lVar23 = -1;
    }
    else {
      lVar23 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    dVar37 = 0.0;
    if (lVar23 != lVar34) {
      lVar5._0_4_ = *(int *)&pGVar30->vFanoutNums;
      lVar5._4_4_ = *(int *)((long)&pGVar30->vFanoutNums + 4);
      iVar9 = 3;
      iVar7 = clock_gettime(3,(timespec *)&ts);
      if (iVar7 < 0) {
        lVar23 = -1;
      }
      else {
        lVar23 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      dVar37 = ((double)lVar5 * 100.0) / (double)(lVar23 - lVar34);
    }
    Abc_Print(iVar9,"%9.2f sec (%6.2f %%)\n",(double)lVar25 / 1000000.0,dVar37);
    Abc_Print(iVar9,"%s =","Runtime: Solver SAT  ");
    piVar11 = *(int **)&pGVar30->nFansAlloc;
    iVar9 = 3;
    iVar7 = clock_gettime(3,(timespec *)&ts);
    if (iVar7 < 0) {
      lVar23 = -1;
    }
    else {
      lVar23 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    dVar37 = 0.0;
    if (lVar23 != lVar34) {
      piVar6 = *(int **)&pGVar30->nFansAlloc;
      iVar9 = 3;
      iVar7 = clock_gettime(3,(timespec *)&ts);
      if (iVar7 < 0) {
        lVar23 = -1;
      }
      else {
        lVar23 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      dVar37 = ((double)(long)piVar6 * 100.0) / (double)(lVar23 - lVar34);
    }
    Abc_Print(iVar9,"%9.2f sec (%6.2f %%)\n",(double)(long)piVar11 / 1000000.0,dVar37);
    Abc_Print(iVar9,"%s =","Runtime: Refinement  ");
    pVVar20 = pGVar30->vFanout;
    iVar9 = 3;
    iVar7 = clock_gettime(3,(timespec *)&ts);
    if (iVar7 < 0) {
      lVar23 = -1;
    }
    else {
      lVar23 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    dVar37 = 0.0;
    if (lVar23 != lVar34) {
      pVVar10 = pGVar30->vFanout;
      iVar9 = 3;
      iVar7 = clock_gettime(3,(timespec *)&ts);
      if (iVar7 < 0) {
        lVar23 = -1;
      }
      else {
        lVar23 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      dVar37 = ((double)(long)pVVar10 * 100.0) / (double)(lVar23 - lVar34);
    }
    Abc_Print(iVar9,"%9.2f sec (%6.2f %%)\n",(double)(long)pVVar20 / 1000000.0,dVar37);
    Abc_Print(iVar9,"%s =","Runtime: Other       ");
    pVVar20 = pGVar30->vMapping;
    iVar9 = 3;
    iVar7 = clock_gettime(3,(timespec *)&ts);
    if (iVar7 < 0) {
      lVar23 = -1;
    }
    else {
      lVar23 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    dVar37 = 0.0;
    if (lVar23 != lVar34) {
      pVVar10 = pGVar30->vMapping;
      iVar9 = 3;
      iVar7 = clock_gettime(3,(timespec *)&ts);
      if (iVar7 < 0) {
        lVar23 = -1;
      }
      else {
        lVar23 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      dVar37 = ((double)(long)pVVar10 * 100.0) / (double)(lVar23 - lVar34);
    }
    Abc_Print(iVar9,"%9.2f sec (%6.2f %%)\n",(double)(long)pVVar20 / 1000000.0,dVar37);
    Abc_Print(iVar9,"%s =","Runtime: TOTAL       ");
    iVar7 = clock_gettime(3,(timespec *)&ts);
    lVar24 = -1;
    lVar23 = -1;
    if (-1 < iVar7) {
      lVar23 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    iVar9 = 3;
    iVar7 = clock_gettime(3,(timespec *)&ts);
    if (-1 < iVar7) {
      lVar24 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    dVar37 = 0.0;
    if (lVar24 != lVar34) {
      iVar7 = clock_gettime(3,(timespec *)&ts);
      lVar25 = -1;
      lVar24 = -1;
      if (-1 < iVar7) {
        lVar24 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      iVar9 = 3;
      iVar7 = clock_gettime(3,(timespec *)&ts);
      if (-1 < iVar7) {
        lVar25 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      dVar37 = ((double)(lVar24 - lVar34) * 100.0) / (double)(lVar25 - lVar34);
    }
    Abc_Print(iVar9,"%9.2f sec (%6.2f %%)\n",(double)(lVar23 - lVar34) / 1000000.0,dVar37);
    Ga2_ManReportMemory((Ga2_Man_t *)pGVar30);
  }
  Ga2_ManStop((Ga2_Man_t *)pGVar30);
  fflush(_stdout);
}

Assistant:

int Gia_ManPerformGla( Gia_Man_t * pAig, Abs_Par_t * pPars )
{
    int fUseSecondCore = 1;
    Ga2_Man_t * p;
    Vec_Int_t * vCore, * vPPis;
    abctime clk2, clk = Abc_Clock();
    int Status = l_Undef, RetValue = -1, iFrameTryToProve = -1, fOneIsSent = 0;
    int i, c, f, Lit;
    pPars->iFrame = -1;
    // check trivial case 
    assert( Gia_ManPoNum(pAig) == 1 ); 
    ABC_FREE( pAig->pCexSeq );
    if ( Gia_ObjIsConst0(Gia_ObjFanin0(Gia_ManPo(pAig,0))) )
    {
        if ( !Gia_ObjFaninC0(Gia_ManPo(pAig,0)) )
        {
            Abc_Print( 1, "Sequential miter is trivially UNSAT.\n" );
            return 1;
        }
        pAig->pCexSeq = Abc_CexMakeTriv( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), 1, 0 );
        Abc_Print( 1, "Sequential miter is trivially SAT.\n" );
        return 0;
    }
    // create gate classes if not given
    if ( pAig->vGateClasses == NULL )
    {
        pAig->vGateClasses = Vec_IntStart( Gia_ManObjNum(pAig) );
        Vec_IntWriteEntry( pAig->vGateClasses, 0, 1 );
        Vec_IntWriteEntry( pAig->vGateClasses, Gia_ObjFaninId0p(pAig, Gia_ManPo(pAig, 0)), 1 );
    }
    // start the manager
    p = Ga2_ManStart( pAig, pPars );
    p->timeInit = Abc_Clock() - clk;
    // perform initial abstraction
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Running gate-level abstraction (GLA) with the following parameters:\n" );
        Abc_Print( 1, "FrameMax = %d  ConfMax = %d  Timeout = %d  Limit = %d %%  Limit2 = %d %%  RatioMax = %d %%\n", 
            pPars->nFramesMax, pPars->nConfLimit, pPars->nTimeOut, pPars->nRatioMin, pPars->nRatioMin2, pPars->nRatioMax );
        Abc_Print( 1, "LrnStart = %d  LrnDelta = %d  LrnRatio = %d %%  Skip = %d  SimpleCNF = %d  Dump = %d\n", 
            pPars->nLearnedStart, pPars->nLearnedDelta, pPars->nLearnedPerce, pPars->fUseSkip, pPars->fUseSimple, pPars->fDumpVabs|pPars->fDumpMabs );
        if ( pPars->fDumpVabs || pPars->fDumpMabs )
            Abc_Print( 1, "%s will be dumped into file \"%s\".\n", 
                pPars->fDumpVabs ? "Abstracted model" : "Miter with abstraction map",
                Ga2_GlaGetFileName(p, pPars->fDumpVabs) );
        Abc_Print( 1, " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n" );
    }
    // iterate unrolling
    for ( i = f = 0; !pPars->nFramesMax || f < pPars->nFramesMax; i++ )
    {
        int nAbsOld;
        // remember the timeframe
        p->pPars->iFrame = -1;
        // create new SAT solver
        Ga2_ManRestart( p );
        // remember abstraction size after the last restart
        nAbsOld = Vec_IntSize(p->vAbs);
        // unroll the circuit
        for ( f = 0; !pPars->nFramesMax || f < pPars->nFramesMax; f++ )
        {
            // remember current limits
            int nConflsBeg = sat_solver2_nconflicts(p->pSat);
            int nAbs       = Vec_IntSize(p->vAbs);
            int nValues    = Vec_IntSize(p->vValues);
            int nVarsOld;
            // remember the timeframe
            p->pPars->iFrame = f;
            // extend and clear storage
            if ( f == Vec_PtrSize(p->vId2Lit) )
                Vec_PtrPush( p->vId2Lit, Vec_IntAlloc(0) );
            Vec_IntFillExtra( Ga2_MapFrameMap(p, f), Vec_IntSize(p->vValues), -1 );
            // add static clauses to this timeframe
            Ga2_ManAddAbsClauses( p, f );
            // skip checking if skipcheck is enabled (&gla -s)
            if ( p->pPars->fUseSkip && f <= p->pPars->iFrameProved )
                continue;
            // skip checking if we need to skip several starting frames (&gla -S <num>)
            if ( p->pPars->nFramesStart && f <= p->pPars->nFramesStart )
                continue;
            // get the output literal
//            Lit = Ga2_ManUnroll_rec( p, Gia_ManPo(pAig,0), f );
            Lit = Ga2_ObjFindLit( p, Gia_ObjFanin0(Gia_ManPo(pAig,0)), f );
            assert( Lit >= 0 );
            Lit = Abc_LitNotCond( Lit, Gia_ObjFaninC0(Gia_ManPo(pAig,0)) );
            if ( Lit == 0 )
                continue;
            assert( Lit > 1 );
            // check for counter-examples
            if ( p->nSatVars > sat_solver2_nvars(p->pSat) )
                sat_solver2_setnvars( p->pSat, p->nSatVars );
            nVarsOld = p->nSatVars;
            for ( c = 0; ; c++ )
            {
                // consider the special case when the target literal is implied false
                // by implications which happened as a result of previous refinements
                // note that incremental UNSAT core cannot be computed because there is no learned clauses
                // in this case, we will assume that UNSAT core cannot reduce the problem
                if ( var_is_assigned(p->pSat, Abc_Lit2Var(Lit)) )
                {
                    Prf_ManStopP( &p->pSat->pPrf2 );
                    break;
                }
                // perform SAT solving
                clk2 = Abc_Clock();
                Status = sat_solver2_solve( p->pSat, &Lit, &Lit+1, (ABC_INT64_T)pPars->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                if ( Status == l_True ) // perform refinement
                {
                    p->nCexes++;
                    p->timeSat += Abc_Clock() - clk2;

                    // cancel old one if it was sent
                    if ( Abc_FrameIsBridgeMode() && fOneIsSent )
                    {
                        Gia_Ga2SendCancel( p, pPars->fVerbose );
                        fOneIsSent = 0;
                    }
                    if ( iFrameTryToProve >= 0 )
                    {
                        Gia_GlaProveCancel( pPars->fVerbose );
                        iFrameTryToProve = -1;
                    }

                    // perform refinement
                    clk2 = Abc_Clock();
                    Rnm_ManSetRefId( p->pRnm, c );
                    vPPis = Ga2_ManRefine( p );
                    p->timeCex += Abc_Clock() - clk2;
                    if ( vPPis == NULL )
                    {
                        if ( pPars->fVerbose )
                            Ga2_ManAbsPrintFrame( p, f, sat_solver2_nconflicts(p->pSat)-nConflsBeg, c, Abc_Clock() - clk, 1 );
                        goto finish;
                    }

                    if ( c == 0 )
                    {
//                        Ga2_ManRefinePrintPPis( p );
                        // create bookmark to be used for rollback
                        assert( nVarsOld == p->pSat->size );
                        sat_solver2_bookmark( p->pSat );
                        // start incremental proof manager
                        assert( p->pSat->pPrf2 == NULL );
                        p->pSat->pPrf2 = Prf_ManAlloc();
                        if ( p->pSat->pPrf2 )
                        {
                            p->nProofIds = 0;
                            Vec_IntFill( p->vProofIds, Gia_ManObjNum(p->pGia), -1 );
                            Prf_ManRestart( p->pSat->pPrf2, p->vProofIds, sat_solver2_nlearnts(p->pSat), Vec_IntSize(vPPis) );
                        }
                    }
                    else
                    {
                        // resize the proof logger
                        if ( p->pSat->pPrf2 )
                            Prf_ManGrow( p->pSat->pPrf2, p->nProofIds + Vec_IntSize(vPPis) );
                    }

                    Ga2_ManAddToAbs( p, vPPis );
                    Vec_IntFree( vPPis );
                    if ( pPars->fVerbose )
                        Ga2_ManAbsPrintFrame( p, f, sat_solver2_nconflicts(p->pSat)-nConflsBeg, c+1, Abc_Clock() - clk, 0 );
                    // check if the number of objects is below limit
                    if ( pPars->nRatioMin2 && Vec_IntSize(p->vAbs) >= p->nMarked * pPars->nRatioMin2 / 100 )
                    {
                        Status = l_Undef;
                        goto finish;
                    }
                    continue;
                }
                p->timeUnsat += Abc_Clock() - clk2;
                if ( Status == l_Undef ) // ran out of resources
                    goto finish;
                if ( p->pSat->nRuntimeLimit && Abc_Clock() > p->pSat->nRuntimeLimit ) // timeout
                    goto finish;
                if ( c == 0 )
                {
                    if ( f > p->pPars->iFrameProved )
                        p->pPars->nFramesNoChange++;
                    break;
                }
                if ( f > p->pPars->iFrameProved )
                    p->pPars->nFramesNoChange = 0;

                // derive the core
                assert( p->pSat->pPrf2 != NULL );
                vCore = (Vec_Int_t *)Sat_ProofCore( p->pSat );
                Prf_ManStopP( &p->pSat->pPrf2 );
                // update the SAT solver
                sat_solver2_rollback( p->pSat );
                // reduce abstraction
                Ga2_ManShrinkAbs( p, nAbs, nValues, nVarsOld );

                // purify UNSAT core
                if ( fUseSecondCore )
                {
//                    int nOldCore = Vec_IntSize(vCore);
                    // reverse the order of objects in the core
//                    Vec_IntSort( vCore, 0 );
//                    Vec_IntPrint( vCore );
                    // create bookmark to be used for rollback
                    assert( nVarsOld == p->pSat->size );
                    sat_solver2_bookmark( p->pSat );
                    // start incremental proof manager
                    assert( p->pSat->pPrf2 == NULL );
                    p->pSat->pPrf2 = Prf_ManAlloc();
                    if ( p->pSat->pPrf2 )
                    {
                        p->nProofIds = 0;
                        Vec_IntFill( p->vProofIds, Gia_ManObjNum(p->pGia), -1 );
                        Prf_ManRestart( p->pSat->pPrf2, p->vProofIds, sat_solver2_nlearnts(p->pSat), Vec_IntSize(vCore) );

                        Ga2_ManAddToAbs( p, vCore );
                        Vec_IntFree( vCore );
                    }
                    // run SAT solver
                    clk2 = Abc_Clock();
                    Status = sat_solver2_solve( p->pSat, &Lit, &Lit+1, (ABC_INT64_T)pPars->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                    if ( Status == l_Undef )
                        goto finish;
                    assert( Status == l_False );
                    p->timeUnsat += Abc_Clock() - clk2;

                    // derive the core
                    assert( p->pSat->pPrf2 != NULL );
                    vCore = (Vec_Int_t *)Sat_ProofCore( p->pSat );
                    Prf_ManStopP( &p->pSat->pPrf2 );
                    // update the SAT solver
                    sat_solver2_rollback( p->pSat );
                    // reduce abstraction
                    Ga2_ManShrinkAbs( p, nAbs, nValues, nVarsOld );
//                    printf( "\n%4d -> %4d\n", nOldCore, Vec_IntSize(vCore) );
                }

                Ga2_ManAddToAbs( p, vCore );
//                Ga2_ManRefinePrint( p, vCore );
                Vec_IntFree( vCore );
                break;
            }
            // remember the last proved frame
            if ( p->pPars->iFrameProved < f )
                p->pPars->iFrameProved = f;
            // print statistics
            if ( pPars->fVerbose )
                Ga2_ManAbsPrintFrame( p, f, sat_solver2_nconflicts(p->pSat)-nConflsBeg, c, Abc_Clock() - clk, 1 );
            // check if abstraction was proved
            if ( Gia_GlaProveCheck( pPars->fVerbose ) )
            {
                RetValue = 1;
                goto finish;
            }
            if ( c > 0 ) 
            {
                if ( p->pPars->fVeryVerbose )
                    Abc_Print( 1, "\n" );
                // recompute the abstraction
                Vec_IntFreeP( &pAig->vGateClasses );
                pAig->vGateClasses = Ga2_ManAbsTranslate( p );
                // check if the number of objects is below limit
                if ( pPars->nRatioMin && Vec_IntSize(p->vAbs) >= p->nMarked * pPars->nRatioMin / 100 )
                {
                    Status = l_Undef;
                    goto finish;
                }
            }
            // check the number of stable frames
            if ( p->pPars->nFramesNoChange == p->pPars->nFramesNoChangeLim )
            {
                // dump the model into file
                if ( p->pPars->fDumpVabs || p->pPars->fDumpMabs )
                {
                    char Command[1000];
                    Abc_FrameSetStatus( -1 );
                    Abc_FrameSetCex( NULL );
                    Abc_FrameSetNFrames( f );
                    sprintf( Command, "write_status %s", Extra_FileNameGenericAppend((char *)(p->pPars->pFileVabs ? p->pPars->pFileVabs : "glabs.aig"), ".status"));
                    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command );
                    Ga2_GlaDumpAbsracted( p, pPars->fVerbose );
                }
                // call the prover
                if ( p->pPars->fCallProver )
                {
                    // cancel old one if it is proving
                    if ( iFrameTryToProve >= 0 )
                        Gia_GlaProveCancel( pPars->fVerbose );
                    // prove new one
                    Gia_GlaProveAbsracted( pAig, pPars->fSimpProver, pPars->fVeryVerbose );
                    iFrameTryToProve = f;
                    p->nPdrCalls++;
                }
                // speak to the bridge
                if ( Abc_FrameIsBridgeMode() )
                {
                    // cancel old one if it was sent
                    if ( fOneIsSent )
                        Gia_Ga2SendCancel( p, pPars->fVerbose );
                    // send new one 
                    Gia_Ga2SendAbsracted( p, pPars->fVerbose );
                    fOneIsSent = 1;
                }
            }
            // if abstraction grew more than a certain percentage, force a restart
            if ( pPars->nRatioMax == 0 )
                continue;
            if ( c > 0 && (f > 20 || Vec_IntSize(p->vAbs) > 100) && Vec_IntSize(p->vAbs) - nAbsOld >= nAbsOld * pPars->nRatioMax / 100 )
            {
                if ( p->pPars->fVerbose )
                Abc_Print( 1, "Forcing restart because abstraction grew from %d to %d (more than %d %%).\n", 
                    nAbsOld, Vec_IntSize(p->vAbs), pPars->nRatioMax );
                break;
            }
        }
    }
finish:
    Prf_ManStopP( &p->pSat->pPrf2 );
    // cancel old one if it is proving
    if ( iFrameTryToProve >= 0 )
        Gia_GlaProveCancel( pPars->fVerbose );
    // analize the results
    if ( !p->fUseNewLine )
        Abc_Print( 1, "\n" );
    if ( RetValue == 1 )
        Abc_Print( 1, "GLA completed %d frames and proved abstraction derived in frame %d  ", p->pPars->iFrameProved+1, iFrameTryToProve );
    else if ( pAig->pCexSeq == NULL )
    {
        Vec_IntFreeP( &pAig->vGateClasses );
        pAig->vGateClasses = Ga2_ManAbsTranslate( p );
        if ( p->pPars->nTimeOut && Abc_Clock() >= p->pSat->nRuntimeLimit ) 
            Abc_Print( 1, "GLA reached timeout %d sec in frame %d with a %d-stable abstraction.    ", p->pPars->nTimeOut, p->pPars->iFrameProved+1, p->pPars->nFramesNoChange );
        else if ( pPars->nConfLimit && sat_solver2_nconflicts(p->pSat) >= pPars->nConfLimit )
            Abc_Print( 1, "GLA exceeded %d conflicts in frame %d with a %d-stable abstraction.  ", pPars->nConfLimit, p->pPars->iFrameProved+1, p->pPars->nFramesNoChange );
        else if ( pPars->nRatioMin2 && Vec_IntSize(p->vAbs) >= p->nMarked * pPars->nRatioMin2 / 100 )
            Abc_Print( 1, "GLA found that the size of abstraction exceeds %d %% in frame %d during refinement.  ", pPars->nRatioMin2, p->pPars->iFrameProved+1 );
        else if ( pPars->nRatioMin && Vec_IntSize(p->vAbs) >= p->nMarked * pPars->nRatioMin / 100 )
            Abc_Print( 1, "GLA found that the size of abstraction exceeds %d %% in frame %d.  ", pPars->nRatioMin, p->pPars->iFrameProved+1 );
        else
            Abc_Print( 1, "GLA finished %d frames and produced a %d-stable abstraction.  ", p->pPars->iFrameProved+1, p->pPars->nFramesNoChange );
        p->pPars->iFrame = p->pPars->iFrameProved;
    }
    else
    {
        if ( p->pPars->fVerbose )
            Abc_Print( 1, "\n" );
        if ( !Gia_ManVerifyCex( pAig, pAig->pCexSeq, 0 ) )
            Abc_Print( 1, "    Gia_ManPerformGlaOld(): CEX verification has failed!\n" );
        Abc_Print( 1, "True counter-example detected in frame %d.  ", f );
        p->pPars->iFrame = f - 1;
        Vec_IntFreeP( &pAig->vGateClasses );
        RetValue = 0;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( p->pPars->fVerbose )
    {
        p->timeOther = (Abc_Clock() - clk) - p->timeUnsat - p->timeSat - p->timeCex - p->timeInit;
        ABC_PRTP( "Runtime: Initializing", p->timeInit,   Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver UNSAT", p->timeUnsat,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver SAT  ", p->timeSat,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Refinement  ", p->timeCex,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Other       ", p->timeOther,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: TOTAL       ", Abc_Clock() - clk, Abc_Clock() - clk );
        Ga2_ManReportMemory( p );
    }
//    Ga2_ManDumpStats( p->pGia, p->pPars, p->pSat, p->pPars->iFrameProved, 0 );
    Ga2_ManStop( p );
    fflush( stdout );
    return RetValue;
}